

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O1

void __thiscall asmjit::v1_14::BaseEmitter::setLogger(BaseEmitter *this,Logger *logger)

{
  DiagnosticOptions DVar1;
  bool bVar2;
  
  if (logger != (Logger *)0x0) {
    this->_logger = logger;
    this->_emitterFlags = this->_emitterFlags | kOwnLogger;
    BaseEmitter_updateForcedOptions(this);
    return;
  }
  this->_logger = (Logger *)0x0;
  this->_emitterFlags = this->_emitterFlags & ~kOwnLogger;
  if (this->_code != (CodeHolder *)0x0) {
    this->_logger = this->_code->_logger;
    BaseEmitter_updateForcedOptions(this);
    return;
  }
  if (this->_emitterType == kAssembler) {
    DVar1 = kValidateAssembler;
    if (this->_code == (CodeHolder *)0x0) {
      bVar2 = false;
    }
    else {
      bVar2 = this->_logger != (Logger *)0x0;
    }
  }
  else {
    bVar2 = this->_code != (CodeHolder *)0x0;
    DVar1 = kValidateIntermediate;
  }
  this->_emitterFlags = bVar2 << 3 | this->_emitterFlags & ~kLogComments;
  if (((this->_code != (CodeHolder *)0x0) && ((this->_diagnosticOptions & DVar1) == kNone)) &&
     (this->_logger == (Logger *)0x0)) {
    *(undefined1 *)&this->_forcedInstOptions = (char)this->_forcedInstOptions & 0xfe;
    return;
  }
  *(undefined1 *)&this->_forcedInstOptions = (char)this->_forcedInstOptions | kReserved;
  return;
}

Assistant:

void BaseEmitter::setLogger(Logger* logger) noexcept {
#ifndef ASMJIT_NO_LOGGING
  if (logger) {
    _logger = logger;
    _addEmitterFlags(EmitterFlags::kOwnLogger);
  }
  else {
    _logger = nullptr;
    _clearEmitterFlags(EmitterFlags::kOwnLogger);
    if (_code)
      _logger = _code->logger();
  }
  BaseEmitter_updateForcedOptions(this);
#else
  DebugUtils::unused(logger);
#endif
}